

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O1

int gost_magma_mgm_ctrl(EVP_CIPHER_CTX *c,int type,int arg,void *ptr)

{
  int iVar1;
  undefined4 uVar2;
  long lVar3;
  void *__src;
  undefined8 *puVar4;
  EVP_CIPHER *pEVar5;
  undefined8 uVar6;
  
  lVar3 = EVP_CIPHER_CTX_get_cipher_data();
  if (type < 0x10) {
    if (type == 0) {
      pEVar5 = EVP_CIPHER_CTX_cipher((EVP_CIPHER_CTX *)c);
      uVar2 = EVP_CIPHER_get_iv_length(pEVar5);
      uVar6 = EVP_CIPHER_CTX_iv_noconst(c);
      *(undefined8 *)(lVar3 + 0x1088) = 0;
      *(undefined4 *)(lVar3 + 0x1160) = uVar2;
      *(undefined8 *)(lVar3 + 0x1158) = uVar6;
      *(undefined4 *)(lVar3 + 0x1164) = 0xffffffff;
    }
    else {
      if (type != 9) {
        return -1;
      }
      if (arg < 1) {
        return 0;
      }
      if ((0x10 < arg) && (*(int *)(lVar3 + 0x1160) < arg)) {
        return 0;
      }
      *(int *)(lVar3 + 0x1160) = arg;
    }
  }
  else if (type == 0x10) {
    __src = (void *)EVP_CIPHER_CTX_buf_noconst(c);
    iVar1 = EVP_CIPHER_CTX_is_encrypting(c);
    if (((7 < arg - 1U) || (iVar1 == 0)) || (*(int *)(lVar3 + 0x1164) < 0)) {
      iVar1 = 0x475;
LAB_0011316a:
      ERR_GOST_error(0xa9,0x8e,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_crypt.c"
                     ,iVar1);
      return 0;
    }
    memcpy(ptr,__src,(ulong)(uint)arg);
  }
  else if (type == 0x11) {
    puVar4 = (undefined8 *)EVP_CIPHER_CTX_buf_noconst(c);
    iVar1 = EVP_CIPHER_CTX_is_encrypting(c);
    if ((arg != 8) || (iVar1 != 0)) {
      iVar1 = 0x469;
      goto LAB_0011316a;
    }
    *puVar4 = *ptr;
    *(undefined4 *)(lVar3 + 0x1164) = 8;
  }
  else {
    if (type != 0x25) {
      return -1;
    }
    *(undefined4 *)ptr = *(undefined4 *)(lVar3 + 0x1160);
  }
  return 1;
}

Assistant:

static int gost_magma_mgm_ctrl(EVP_CIPHER_CTX *c, int type, int arg, void *ptr)
{
    gost_mgm_ctx *mctx =
        (gost_mgm_ctx *)EVP_CIPHER_CTX_get_cipher_data(c);
    unsigned char *buf, *iv;
    int ivlen, enc;

    switch (type) {
    case EVP_CTRL_INIT:
        ivlen = EVP_CIPHER_iv_length(EVP_CIPHER_CTX_cipher(c));
        iv = EVP_CIPHER_CTX_iv_noconst(c);
        mctx->key_set = 0;
        mctx->iv_set = 0;
        mctx->ivlen = ivlen;
        mctx->iv = iv;
        mctx->taglen = -1;
        return 1;

    case EVP_CTRL_GET_IVLEN:
        *(int *)ptr = mctx->ivlen;
        return 1;

    case EVP_CTRL_AEAD_SET_IVLEN:
        if (arg <= 0)
            return 0;
        if ((arg > EVP_MAX_IV_LENGTH) && (arg > mctx->ivlen)) {
            // TODO: Allocate memory for IV or set error
            return 0;
        }
        mctx->ivlen = arg;
        return 1;

    case EVP_CTRL_AEAD_SET_TAG:
        buf = EVP_CIPHER_CTX_buf_noconst(c);
        enc = EVP_CIPHER_CTX_encrypting(c);
        if (arg <= 0 || arg != 8 || enc) {
            GOSTerr(GOST_F_GOST_MAGMA_MGM_CTRL,
                    GOST_R_INVALID_TAG_LENGTH);
            return 0;
        }
        memcpy(buf, ptr, arg);
        mctx->taglen = arg;
        return 1;

    case EVP_CTRL_AEAD_GET_TAG:
        buf = EVP_CIPHER_CTX_buf_noconst(c);
        enc = EVP_CIPHER_CTX_encrypting(c);
        if (arg <= 0 || arg > 8 || !enc || mctx->taglen < 0) {
            GOSTerr(GOST_F_GOST_MAGMA_MGM_CTRL,
                    GOST_R_INVALID_TAG_LENGTH);
            return 0;
        }
        memcpy(ptr, buf, arg);
        return 1;

    default:
        return -1;
    }
}